

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O1

Result * CoreML::validateLSTMWeightParams
                   (Result *__return_storage_ptr__,LSTMWeightParams *lstmWeightParams,
                   LSTMParams *lstmParams)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  uint uVar5;
  WeightParamType *wt;
  WeightParams *pWVar6;
  pointer pWVar7;
  uint uVar8;
  WeightParamType WVar9;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *__range1;
  int iVar10;
  int iVar11;
  uint uVar12;
  bool bVar13;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> weightTypes;
  string err;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> local_58;
  string local_40;
  
  bVar13 = lstmParams->hasbiasvectors_;
  bVar1 = lstmParams->haspeepholevectors_;
  local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_start = (WeightParamType *)0x0;
  local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (WeightParamType *)0x0;
  local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (WeightParamType *)0x0;
  pWVar6 = lstmWeightParams->inputgateweightmatrix_;
  if (pWVar6 == (WeightParams *)0x0) {
    pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar10 = (pWVar6->floatvalue_).current_size_;
  sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
  uVar12 = (0 < iVar10) + 1;
  if (sVar2 == 0) {
    uVar12 = (uint)(0 < iVar10);
  }
  sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
  sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
  uVar5 = (uint)(sVar4 == 0);
  uVar12 = (uVar12 - (sVar3 == 0)) + 2;
  uVar8 = 4;
  if (uVar12 - uVar5 < 2) {
    uVar8 = 5;
    if (uVar12 != uVar5) {
      uVar8 = (uint)(iVar10 < 1);
    }
    if (((((sVar2 == 0) && (iVar10 < 1)) && (uVar12 != uVar5)) &&
        (((sVar3 == 0 || (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (uVar8 = 2, pWVar6->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar4 == 0 || (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_))
        || (uVar8 = 3, pWVar6->quantization_ == (QuantizationParams *)0x0)))) {
      uVar8 = 5;
    }
  }
  local_40._M_dataplus._M_p._0_4_ = uVar8;
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  _M_realloc_insert<CoreML::WeightParamType>(&local_58,(iterator)0x0,(WeightParamType *)&local_40);
  pWVar6 = lstmWeightParams->forgetgateweightmatrix_;
  if (pWVar6 == (WeightParams *)0x0) {
    pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar10 = (pWVar6->floatvalue_).current_size_;
  sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
  uVar12 = (0 < iVar10) + 1;
  if (sVar2 == 0) {
    uVar12 = (uint)(0 < iVar10);
  }
  sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
  sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
  uVar5 = (uint)(sVar4 == 0);
  uVar12 = (uVar12 - (sVar3 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar12 - uVar5 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar12 != uVar5) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if ((((sVar2 == 0) && (iVar10 < 1)) && (uVar12 != uVar5)) &&
       ((((sVar3 == 0 || (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QUINT,
               pWVar6->quantization_ == (QuantizationParams *)0x0)) &&
        (((sVar4 == 0 || (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QINT,
               pWVar6->quantization_ == (QuantizationParams *)0x0)))))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pWVar6 = lstmWeightParams->blockinputweightmatrix_;
  if (pWVar6 == (WeightParams *)0x0) {
    pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar10 = (pWVar6->floatvalue_).current_size_;
  sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
  uVar12 = (0 < iVar10) + 1;
  if (sVar2 == 0) {
    uVar12 = (uint)(0 < iVar10);
  }
  sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
  sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
  uVar5 = (uint)(sVar4 == 0);
  uVar12 = (uVar12 - (sVar3 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar12 - uVar5 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar12 != uVar5) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if (((((sVar2 == 0) && (iVar10 < 1)) && (uVar12 != uVar5)) &&
        (((sVar3 == 0 || (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QUINT,
               pWVar6->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar4 == 0 || (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_))
        || (local_40._M_dataplus._M_p._0_4_ = QINT,
           pWVar6->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pWVar6 = lstmWeightParams->outputgateweightmatrix_;
  if (pWVar6 == (WeightParams *)0x0) {
    pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar10 = (pWVar6->floatvalue_).current_size_;
  sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
  uVar12 = (0 < iVar10) + 1;
  if (sVar2 == 0) {
    uVar12 = (uint)(0 < iVar10);
  }
  sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
  sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
  uVar5 = (uint)(sVar4 == 0);
  uVar12 = (uVar12 - (sVar3 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar12 - uVar5 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar12 != uVar5) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if (((((sVar2 == 0) && (iVar10 < 1)) && (uVar12 != uVar5)) &&
        (((sVar3 == 0 || (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QUINT,
               pWVar6->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar4 == 0 || (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_))
        || (local_40._M_dataplus._M_p._0_4_ = QINT,
           pWVar6->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pWVar6 = lstmWeightParams->inputgaterecursionmatrix_;
  if (pWVar6 == (WeightParams *)0x0) {
    pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar10 = (pWVar6->floatvalue_).current_size_;
  sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
  uVar12 = (0 < iVar10) + 1;
  if (sVar2 == 0) {
    uVar12 = (uint)(0 < iVar10);
  }
  sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
  sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
  uVar5 = (uint)(sVar4 == 0);
  uVar12 = (uVar12 - (sVar3 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar12 - uVar5 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar12 != uVar5) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if (((((sVar2 == 0) && (iVar10 < 1)) && (uVar12 != uVar5)) &&
        (((sVar3 == 0 || (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QUINT,
               pWVar6->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar4 == 0 || (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_))
        || (local_40._M_dataplus._M_p._0_4_ = QINT,
           pWVar6->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pWVar6 = lstmWeightParams->forgetgaterecursionmatrix_;
  if (pWVar6 == (WeightParams *)0x0) {
    pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar10 = (pWVar6->floatvalue_).current_size_;
  sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
  uVar12 = (0 < iVar10) + 1;
  if (sVar2 == 0) {
    uVar12 = (uint)(0 < iVar10);
  }
  sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
  sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
  uVar5 = (uint)(sVar4 == 0);
  uVar12 = (uVar12 - (sVar3 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar12 - uVar5 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar12 != uVar5) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if (((((sVar2 == 0) && (iVar10 < 1)) && (uVar12 != uVar5)) &&
        (((sVar3 == 0 || (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QUINT,
               pWVar6->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar4 == 0 || (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_))
        || (local_40._M_dataplus._M_p._0_4_ = QINT,
           pWVar6->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pWVar6 = lstmWeightParams->blockinputrecursionmatrix_;
  if (pWVar6 == (WeightParams *)0x0) {
    pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar10 = (pWVar6->floatvalue_).current_size_;
  sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
  uVar12 = (0 < iVar10) + 1;
  if (sVar2 == 0) {
    uVar12 = (uint)(0 < iVar10);
  }
  sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
  sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
  uVar5 = (uint)(sVar4 == 0);
  uVar12 = (uVar12 - (sVar3 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar12 - uVar5 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar12 != uVar5) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if (((((sVar2 == 0) && (iVar10 < 1)) && (uVar12 != uVar5)) &&
        (((sVar3 == 0 || (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QUINT,
               pWVar6->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar4 == 0 || (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_))
        || (local_40._M_dataplus._M_p._0_4_ = QINT,
           pWVar6->quantization_ == (QuantizationParams *)0x0)))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pWVar6 = lstmWeightParams->outputgaterecursionmatrix_;
  if (pWVar6 == (WeightParams *)0x0) {
    pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar10 = (pWVar6->floatvalue_).current_size_;
  sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
  uVar12 = (0 < iVar10) + 1;
  if (sVar2 == 0) {
    uVar12 = (uint)(0 < iVar10);
  }
  sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
  sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
  uVar5 = (uint)(sVar4 == 0);
  uVar12 = (uVar12 - (sVar3 == 0)) + 2;
  local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
  if (uVar12 - uVar5 < 2) {
    local_40._M_dataplus._M_p._0_4_ = EMPTY;
    if (uVar12 != uVar5) {
      local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
    }
    if ((((sVar2 == 0) && (iVar10 < 1)) && (uVar12 != uVar5)) &&
       ((((sVar3 == 0 || (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QUINT,
               pWVar6->quantization_ == (QuantizationParams *)0x0)) &&
        (((sVar4 == 0 || (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)
          ) || (local_40._M_dataplus._M_p._0_4_ = QINT,
               pWVar6->quantization_ == (QuantizationParams *)0x0)))))) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_58,
               (iterator)
               local_58.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
  }
  else {
    *local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
    local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (bVar13 != false) {
    pWVar6 = lstmWeightParams->inputgatebiasvector_;
    if (pWVar6 == (WeightParams *)0x0) {
      pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar10 = (pWVar6->floatvalue_).current_size_;
    sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
    uVar12 = (0 < iVar10) + 1;
    if (sVar2 == 0) {
      uVar12 = (uint)(0 < iVar10);
    }
    sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
    sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
    uVar5 = (uint)(sVar4 == 0);
    uVar12 = (uVar12 - (sVar3 == 0)) + 2;
    WVar9 = UNSPECIFIED;
    if (uVar12 - uVar5 < 2) {
      WVar9 = EMPTY;
      if (uVar12 != uVar5) {
        WVar9 = (uint)(iVar10 < 1);
      }
      if (((((sVar2 == 0) && (iVar10 < 1)) && (uVar12 != uVar5)) &&
          (((sVar3 == 0 ||
            (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (WVar9 = QUINT, pWVar6->quantization_ == (QuantizationParams *)0x0)))) &&
         (((sVar4 == 0 ||
           (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
          (WVar9 = QINT, pWVar6->quantization_ == (QuantizationParams *)0x0)))) {
        WVar9 = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_40._M_dataplus._M_p._0_4_ = WVar9;
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = WVar9;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pWVar6 = lstmWeightParams->forgetgatebiasvector_;
    if (pWVar6 == (WeightParams *)0x0) {
      pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar10 = (pWVar6->floatvalue_).current_size_;
    sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
    uVar12 = (0 < iVar10) + 1;
    if (sVar2 == 0) {
      uVar12 = (uint)(0 < iVar10);
    }
    sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
    sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
    uVar5 = (uint)(sVar4 == 0);
    uVar12 = (uVar12 - (sVar3 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar12 - uVar5 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar12 != uVar5) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
      }
      if (((((sVar2 == 0) && (iVar10 < 1)) && (uVar12 != uVar5)) &&
          (((sVar3 == 0 ||
            (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           pWVar6->quantization_ == (QuantizationParams *)0x0)))) &&
         (((sVar4 == 0 ||
           (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
          (local_40._M_dataplus._M_p._0_4_ = QINT,
          pWVar6->quantization_ == (QuantizationParams *)0x0)))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pWVar6 = lstmWeightParams->blockinputbiasvector_;
    if (pWVar6 == (WeightParams *)0x0) {
      pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar10 = (pWVar6->floatvalue_).current_size_;
    sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
    uVar12 = (0 < iVar10) + 1;
    if (sVar2 == 0) {
      uVar12 = (uint)(0 < iVar10);
    }
    sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
    sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
    uVar5 = (uint)(sVar4 == 0);
    uVar12 = (uVar12 - (sVar3 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar12 - uVar5 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar12 != uVar5) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
      }
      if ((((sVar2 == 0) && (iVar10 < 1)) && (uVar12 != uVar5)) &&
         ((((sVar3 == 0 ||
            (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           pWVar6->quantization_ == (QuantizationParams *)0x0)) &&
          (((sVar4 == 0 ||
            (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QINT,
           pWVar6->quantization_ == (QuantizationParams *)0x0)))))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pWVar6 = lstmWeightParams->outputgatebiasvector_;
    if (pWVar6 == (WeightParams *)0x0) {
      pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar10 = (pWVar6->floatvalue_).current_size_;
    sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
    uVar12 = (0 < iVar10) + 1;
    if (sVar2 == 0) {
      uVar12 = (uint)(0 < iVar10);
    }
    sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
    sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
    uVar5 = (uint)(sVar4 == 0);
    uVar12 = (uVar12 - (sVar3 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar12 - uVar5 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar12 != uVar5) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
      }
      if (((((sVar2 == 0) && (iVar10 < 1)) && (uVar12 != uVar5)) &&
          (((sVar3 == 0 ||
            (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           pWVar6->quantization_ == (QuantizationParams *)0x0)))) &&
         (((sVar4 == 0 ||
           (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
          (local_40._M_dataplus._M_p._0_4_ = QINT,
          pWVar6->quantization_ == (QuantizationParams *)0x0)))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (bVar1 != false) {
    pWVar6 = lstmWeightParams->inputgatepeepholevector_;
    if (pWVar6 == (WeightParams *)0x0) {
      pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar10 = (pWVar6->floatvalue_).current_size_;
    sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
    uVar12 = (0 < iVar10) + 1;
    if (sVar2 == 0) {
      uVar12 = (uint)(0 < iVar10);
    }
    sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
    sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
    uVar5 = (uint)(sVar4 == 0);
    uVar12 = (uVar12 - (sVar3 == 0)) + 2;
    WVar9 = UNSPECIFIED;
    if (uVar12 - uVar5 < 2) {
      WVar9 = EMPTY;
      if (uVar12 != uVar5) {
        WVar9 = (uint)(iVar10 < 1);
      }
      if (((((sVar2 == 0) && (iVar10 < 1)) && (uVar12 != uVar5)) &&
          (((sVar3 == 0 ||
            (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (WVar9 = QUINT, pWVar6->quantization_ == (QuantizationParams *)0x0)))) &&
         (((sVar4 == 0 ||
           (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
          (WVar9 = QINT, pWVar6->quantization_ == (QuantizationParams *)0x0)))) {
        WVar9 = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_40._M_dataplus._M_p._0_4_ = WVar9;
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = WVar9;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pWVar6 = lstmWeightParams->forgetgatepeepholevector_;
    if (pWVar6 == (WeightParams *)0x0) {
      pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar10 = (pWVar6->floatvalue_).current_size_;
    sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
    uVar12 = (0 < iVar10) + 1;
    if (sVar2 == 0) {
      uVar12 = (uint)(0 < iVar10);
    }
    sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
    sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
    uVar5 = (uint)(sVar4 == 0);
    uVar12 = (uVar12 - (sVar3 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar12 - uVar5 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar12 != uVar5) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
      }
      if ((((sVar2 == 0) && (iVar10 < 1)) && (uVar12 != uVar5)) &&
         ((((sVar3 == 0 ||
            (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           pWVar6->quantization_ == (QuantizationParams *)0x0)) &&
          (((sVar4 == 0 ||
            (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QINT,
           pWVar6->quantization_ == (QuantizationParams *)0x0)))))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pWVar6 = lstmWeightParams->outputgatepeepholevector_;
    if (pWVar6 == (WeightParams *)0x0) {
      pWVar6 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar10 = (pWVar6->floatvalue_).current_size_;
    sVar2 = ((pWVar6->float16value_).ptr_)->_M_string_length;
    uVar12 = (0 < iVar10) + 1;
    if (sVar2 == 0) {
      uVar12 = (uint)(0 < iVar10);
    }
    sVar3 = ((pWVar6->rawvalue_).ptr_)->_M_string_length;
    sVar4 = ((pWVar6->int8rawvalue_).ptr_)->_M_string_length;
    uVar5 = (uint)(sVar4 == 0);
    uVar12 = (uVar12 - (sVar3 == 0)) + 2;
    local_40._M_dataplus._M_p._0_4_ = UNSPECIFIED;
    if (uVar12 - uVar5 < 2) {
      local_40._M_dataplus._M_p._0_4_ = EMPTY;
      if (uVar12 != uVar5) {
        local_40._M_dataplus._M_p._0_4_ = (uint)(iVar10 < 1);
      }
      if (((((sVar2 == 0) && (iVar10 < 1)) && (uVar12 != uVar5)) &&
          (((sVar3 == 0 ||
            (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_40._M_dataplus._M_p._0_4_ = QUINT,
           pWVar6->quantization_ == (QuantizationParams *)0x0)))) &&
         (((sVar4 == 0 ||
           (pWVar6 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
          (local_40._M_dataplus._M_p._0_4_ = QINT,
          pWVar6->quantization_ == (QuantizationParams *)0x0)))) {
        local_40._M_dataplus._M_p._0_4_ = EMPTY;
      }
    }
    if (local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)&local_40);
    }
    else {
      *local_58.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = (WeightParamType)local_40._M_dataplus._M_p;
      local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  bVar13 = local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_start ==
           local_58.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (!bVar13) {
    iVar10 = 0;
    iVar11 = 0;
    pWVar7 = local_58.
             super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      if (*pWVar7 == FLOAT16) {
        iVar11 = iVar11 + 1;
      }
      else if (*pWVar7 == FLOAT32) {
        iVar10 = iVar10 + 1;
      }
      if (0 < iVar10 * iVar11) break;
      pWVar7 = pWVar7 + 1;
      bVar13 = pWVar7 == local_58.
                         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar13);
  }
  if (bVar13) {
    Result::Result(__return_storage_ptr__);
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "LSTM weight parameters have inconsistent field value types. Types should match and should be either half or full precision"
               ,"");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_58.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_start != (WeightParamType *)0x0) {
    operator_delete(local_58.
                    super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateLSTMWeightParams(const Specification::LSTMWeightParams& lstmWeightParams, const Specification::LSTMParams lstmParams) {
    bool has_peephole_vector = lstmParams.haspeepholevectors();
    bool has_bias_vector = lstmParams.hasbiasvectors();
    
    // Validate all weightParam types match
    std::vector<CoreML::WeightParamType> weightTypes;
    weightTypes.push_back(valueType(lstmWeightParams.inputgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.forgetgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.blockinputweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.outputgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.inputgaterecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.forgetgaterecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.blockinputrecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.outputgaterecursionmatrix()));
    if(has_bias_vector){
        weightTypes.push_back(valueType(lstmWeightParams.inputgatebiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.forgetgatebiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.blockinputbiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.outputgatebiasvector()));
    }
    if(has_peephole_vector){
        weightTypes.push_back(valueType(lstmWeightParams.inputgatepeepholevector()));
        weightTypes.push_back(valueType(lstmWeightParams.forgetgatepeepholevector()));
        weightTypes.push_back(valueType(lstmWeightParams.outputgatepeepholevector()));
    }
    if(!isWeightParamTypeCompatible(weightTypes)){
        const std::string err = "LSTM weight parameters have inconsistent field value types. "
        "Types should match and should be either half or full precision";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}